

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O0

SyntaxListBase * __thiscall
slang::syntax::SyntaxListBase::operator=(SyntaxListBase *this,SyntaxListBase *param_1)

{
  undefined4 uVar1;
  SyntaxListBase *param_1_local;
  SyntaxListBase *this_local;
  
  uVar1 = *(undefined4 *)&(param_1->super_SyntaxNode).field_0x4;
  (this->super_SyntaxNode).kind = (param_1->super_SyntaxNode).kind;
  *(undefined4 *)&(this->super_SyntaxNode).field_0x4 = uVar1;
  (this->super_SyntaxNode).parent = (param_1->super_SyntaxNode).parent;
  (this->super_SyntaxNode).previewNode = (param_1->super_SyntaxNode).previewNode;
  this->childCount = param_1->childCount;
  return this;
}

Assistant:

class SLANG_EXPORT SyntaxListBase : public SyntaxNode {
public:
    /// Gets the number of child items in the node.
    size_t getChildCount() const { return childCount; }

    /// Gets the child (token or node) at the given index.
    virtual TokenOrSyntax getChild(size_t index) = 0;

    /// Gets the child (token or node) at the given index.
    virtual ConstTokenOrSyntax getChild(size_t index) const = 0;

    // Gets the child pointer (token or node) at given index.
    virtual PtrTokenOrSyntax getChildPtr(size_t index) = 0;

    /// Sets the child (token or node) at the given index.
    virtual void setChild(size_t index, TokenOrSyntax child) = 0;

    /// Clones the list into a new node using the provided allocator.
    virtual SyntaxListBase* clone(BumpAllocator& alloc) const = 0;

    /// Overwrites all children with the new set of provided @a children (and making
    /// a copy with the provided allocator).
    virtual void resetAll(BumpAllocator& alloc, std::span<const TokenOrSyntax> children) = 0;

    static bool isKind(SyntaxKind kind);

    static bool isChildOptional(size_t index);

protected:
    SyntaxListBase(SyntaxKind kind, size_t childCount) : SyntaxNode(kind), childCount(childCount) {}

    size_t childCount;
}